

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkIvyFraig(Abc_Ntk_t *pNtk,int nConfLimit,int fDoSparse,int fProve,int fTransfer,int fVerbose)

{
  Ivy_Man_t *pManAig;
  Ivy_Man_t *pMan_00;
  Vec_Ptr_t *vCopies_00;
  Vec_Ptr_t *vCopies;
  Ivy_Man_t *pTemp;
  Ivy_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  Ivy_FraigParams_t *pParams;
  Ivy_FraigParams_t Params;
  int fVerbose_local;
  int fTransfer_local;
  int fProve_local;
  int fDoSparse_local;
  int nConfLimit_local;
  Abc_Ntk_t *pNtk_local;
  
  Params._60_4_ = fVerbose;
  pManAig = Abc_NtkIvyBefore(pNtk,0,0);
  if (pManAig == (Ivy_Man_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    Ivy_FraigParamsDefault((Ivy_FraigParams_t *)&pParams);
    Params.dActConeBumpMax._4_4_ = Params._60_4_;
    Params.dActConeBumpMax._0_4_ = fProve;
    Params.fProve = fDoSparse;
    Params.fVerbose = nConfLimit;
    pMan_00 = Ivy_FraigPerform(pManAig,(Ivy_FraigParams_t *)&pParams);
    if (fTransfer == 1) {
      vCopies_00 = Abc_NtkSaveCopy(pNtk);
      pMan = (Ivy_Man_t *)Abc_NtkIvyAfter(pNtk,pMan_00,0,0);
      Abc_NtkLoadCopy(pNtk,vCopies_00);
      Vec_PtrFree(vCopies_00);
      Abc_NtkTransferPointers(pNtk,(Abc_Ntk_t *)pMan);
    }
    else {
      pMan = (Ivy_Man_t *)Abc_NtkIvyAfter(pNtk,pMan_00,0,0);
    }
    Ivy_ManStop(pManAig);
    Ivy_ManStop(pMan_00);
    pNtk_local = (Abc_Ntk_t *)pMan;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyFraig( Abc_Ntk_t * pNtk, int nConfLimit, int fDoSparse, int fProve, int fTransfer, int fVerbose )
{
    Ivy_FraigParams_t Params, * pParams = &Params; 
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan, * pTemp;
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    Ivy_FraigParamsDefault( pParams );
    pParams->nBTLimitNode = nConfLimit;
    pParams->fVerbose     = fVerbose;
    pParams->fProve       = fProve;
    pParams->fDoSparse    = fDoSparse;
    pMan = Ivy_FraigPerform( pTemp = pMan, pParams );
    // transfer the pointers
    if ( fTransfer == 1 )
    {
        Vec_Ptr_t * vCopies;
        vCopies = Abc_NtkSaveCopy( pNtk );
        pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
        Abc_NtkLoadCopy( pNtk, vCopies );
        Vec_PtrFree( vCopies );
        Abc_NtkTransferPointers( pNtk, pNtkAig );
    }
    else
        pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
    Ivy_ManStop( pTemp );
    Ivy_ManStop( pMan );
    return pNtkAig;
}